

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress_reporter.h
# Opt level: O0

void __thiscall
bandit::detail::progress_reporter::context_starting(progress_reporter *this,char *desc)

{
  allocator local_39;
  string local_38 [32];
  char *local_18;
  char *desc_local;
  progress_reporter *this_local;
  
  local_18 = desc;
  desc_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,desc,&local_39);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->contexts_,(value_type *)local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return;
}

Assistant:

virtual void context_starting(const char* desc) 
    {
      contexts_.push_back(std::string(desc));
    }